

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splitview.c
# Opt level: O2

void windowRefreshFun(GLFWwindow *window)

{
  vec4 *pafVar1;
  ulong uVar2;
  float fVar3;
  undefined4 uVar4;
  float local_fc;
  GLfloat light_ambient [4];
  GLfloat light_specular [4];
  GLfloat light_diffuse [4];
  GLfloat light_position [4];
  vec3 center_3;
  vec3 center;
  mat4x4 view;
  
  light_position[0] = 0.0;
  light_position[1] = 8.0;
  light_position[2] = 8.0;
  light_position[3] = 1.0;
  light_diffuse[0] = 1.0;
  light_diffuse[1] = 1.0;
  light_diffuse[2] = 1.0;
  light_diffuse[3] = 1.0;
  light_specular[0] = 1.0;
  light_specular[1] = 1.0;
  light_specular[2] = 1.0;
  light_specular[3] = 1.0;
  light_ambient[0] = 0.2;
  light_ambient[1] = 0.2;
  light_ambient[2] = 0.3;
  light_ambient[3] = 1.0;
  if (height < 1) {
    local_fc = 1.0;
  }
  else {
    local_fc = (float)width / (float)height;
  }
  glClearColor(0,0,0,0);
  glClear(0x4100);
  glEnable(0xc11);
  glEnable(0xb71);
  glDepthFunc(0x203);
  glPolygonMode(0x408,0x1b01);
  glEnable(0xb20);
  glEnable(0xbe2);
  glBlendFunc(0x302,0x303);
  glMatrixMode(0x1701);
  glLoadIdentity();
  glOrtho(SUB84((double)local_fc * -3.0,0),(double)local_fc * 3.0,0xc008000000000000,
          0x4008000000000000,0x3ff0000000000000,0x4049000000000000);
  glViewport(0,(long)height / 2 & 0xffffffff,(long)width / 2 & 0xffffffff);
  glScissor(0,(long)height / 2 & 0xffffffff,(long)width / 2 & 0xffffffff);
  glMatrixMode(0x1700);
  center[2] = 0.0;
  center[0] = 0.0;
  center[1] = 0.0;
  mat4x4_look_at(view,(float *)&DAT_0010f14c,center,(float *)&DAT_0010f188);
  pafVar1 = view;
  fVar3 = (float)glLoadMatrixf();
  drawGrid(fVar3,(int)pafVar1);
  drawScene();
  glViewport(0,0,(long)width / 2 & 0xffffffff,(long)height / 2 & 0xffffffff);
  glScissor(0,0,(long)width / 2 & 0xffffffff,(long)height / 2 & 0xffffffff);
  glMatrixMode(0x1700);
  center[2] = 0.0;
  center[0] = 0.0;
  center[1] = 0.0;
  mat4x4_look_at(view,(float *)&DAT_0010f158,center,(float *)&DAT_0010f188);
  pafVar1 = view;
  fVar3 = (float)glLoadMatrixf();
  drawGrid(fVar3,(int)pafVar1);
  drawScene();
  uVar2 = (long)width / 2 & 0xffffffff;
  glViewport(uVar2,0,uVar2,(long)height / 2 & 0xffffffff);
  uVar2 = (long)width / 2 & 0xffffffff;
  glScissor(uVar2,0,uVar2,(long)height / 2 & 0xffffffff);
  glMatrixMode(0x1700);
  center[2] = 0.0;
  center[0] = 0.0;
  center[1] = 0.0;
  mat4x4_look_at(view,(float *)&DAT_0010f164,center,(float *)&DAT_0010f188);
  pafVar1 = view;
  fVar3 = (float)glLoadMatrixf();
  drawGrid(fVar3,(int)pafVar1);
  drawScene();
  glDisable(0xb20);
  glDisable(0xbe2);
  glPolygonMode(0x408,0x1b02);
  glEnable(0xb44);
  glCullFace(0x405);
  glFrontFace(0x900);
  glMatrixMode(0x1701);
  center[0] = 1.5696855 / local_fc;
  center[1] = 0.0;
  center[2] = 0.0;
  glLoadMatrixf(center);
  uVar2 = (long)width / 2 & 0xffffffff;
  glViewport(uVar2,(long)height / 2 & 0xffffffff,uVar2,(long)height / 2 & 0xffffffff);
  uVar2 = (long)width / 2 & 0xffffffff;
  glScissor(uVar2,(long)height / 2 & 0xffffffff,uVar2,(long)height / 2 & 0xffffffff);
  glMatrixMode(0x1700);
  center_3[2] = 0.0;
  center_3[0] = 0.0;
  center_3[1] = 0.0;
  mat4x4_look_at(view,(float *)&DAT_0010f170,center_3,(float *)&DAT_0010f188);
  glLoadMatrixf(view);
  glLightfv(0x4001,0x1203,light_position);
  glLightfv(0x4001,0x1200,light_ambient);
  glLightfv(0x4001,0x1201,light_diffuse);
  glLightfv(0x4001,0x1202,light_specular);
  glEnable(0x4001);
  glEnable(0xb50);
  drawScene();
  glDisable(0xb50);
  glDisable(0xb44);
  glDisable(0xb71);
  glDisable(0xc11);
  if (active_view != 2 && 0 < active_view) {
    glViewport(0,0,width,height);
    glMatrixMode(0x1701);
    glLoadIdentity();
    uVar4 = 0x40000000;
    glOrtho(0,0x4000000000000000,0,0x4000000000000000,0,0x3ff0000000000000);
    glMatrixMode(0x1700);
    glLoadIdentity();
    glTranslatef((float)(active_view - 1U & 1),
                 CONCAT44(uVar4,(float)((int)(active_view - 1U) / -2 + 1)),0);
    glColor3f(0x3f800000,0x3f800000,0x3f19999a);
    glBegin(3);
    glVertex2i(0,0);
    glVertex2i(1,0);
    glVertex2i(1,1);
    glVertex2i(0,1);
    glVertex2i(0,0);
    glEnd();
  }
  glfwSwapBuffers(window);
  do_redraw = 1;
  return;
}

Assistant:

static void windowRefreshFun(GLFWwindow* window)
{
    drawAllViews();
    glfwSwapBuffers(window);
    do_redraw = 0;
}